

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-util.c
# Opt level: O3

object * get_random_monster_object(monster_conflict *mon)

{
  _Bool _Var1;
  uint32_t uVar2;
  object *poVar3;
  uint32_t m;
  object *poVar4;
  
  poVar4 = mon->held_obj;
  if (poVar4 == (object *)0x0) {
    poVar3 = (object *)0x0;
  }
  else {
    m = 1;
    poVar3 = (object *)0x0;
    do {
      if ((poVar4->artifact == (artifact *)0x0) ||
         (_Var1 = flag_has_dbg(poVar4->kind->kind_flags,2,5,"obj->kind->kind_flags","KF_QUEST_ART"),
         !_Var1)) {
        uVar2 = Rand_div(m);
        if (uVar2 == 0) {
          poVar3 = poVar4;
        }
        m = m + 1;
      }
      poVar4 = poVar4->next;
    } while (poVar4 != (object *)0x0);
  }
  return poVar3;
}

Assistant:

struct object *get_random_monster_object(struct monster *mon)
{
    struct object *obj, *pick = NULL;
    int i = 1;

    /* Pick a random object */
    for (obj = mon->held_obj; obj; obj = obj->next)
    {
        /* Check it isn't a quest artifact */
        if (obj->artifact && kf_has(obj->kind->kind_flags, KF_QUEST_ART))
            continue;

        if (one_in_(i)) pick = obj;
        i++;
    }

    return pick;
}